

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack11.cpp
# Opt level: O0

bool __thiscall
msgpack11::NumberValue<(msgpack11::MsgPack::Type)10,_unsigned_long>::less
          (NumberValue<(msgpack11::MsgPack::Type)10,_unsigned_long> *this,MsgPackValue *other)

{
  int iVar1;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  MsgPackValue *other_local;
  NumberValue<(msgpack11::MsgPack::Type)10,_unsigned_long> *this_local;
  
  iVar1 = (*other->_vptr_MsgPackValue[3])();
  if (iVar1 - 1U < 10) {
    (*(this->super_Value<(msgpack11::MsgPack::Type)10,_unsigned_long>).super_MsgPackValue.
      _vptr_MsgPackValue[6])();
    (*other->_vptr_MsgPackValue[6])();
    this_local._7_1_ = extraout_XMM0_Qa < extraout_XMM0_Qa_00;
  }
  else {
    this_local._7_1_ =
         Value<(msgpack11::MsgPack::Type)10,_unsigned_long>::less
                   (&this->super_Value<(msgpack11::MsgPack::Type)10,_unsigned_long>,other);
  }
  return this_local._7_1_;
}

Assistant:

bool less(const MsgPackValue * other) const override {
        switch( other->type() )
        {
            case MsgPack::FLOAT32 : // fall through
            case MsgPack::FLOAT64 : // fall through
            case MsgPack::UINT8   : // fall through
            case MsgPack::UINT16  : // fall through
            case MsgPack::UINT32  : // fall through
            case MsgPack::UINT64  : // fall through
            case MsgPack::INT8    : // fall through
            case MsgPack::INT16   : // fall through
            case MsgPack::INT32   : // fall through
            case MsgPack::INT64   : // fall through
            {
                return float64_value() < other->float64_value();
            } break;
            default               :
            {
                return Value<tag,T>::less( other );
            } break;
        }
    }